

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_ssat_aarch64(CPUARMState_conflict *env,uint32_t x,uint32_t shift)

{
  uint32_t uVar1;
  uint32_t shift_local;
  uint32_t x_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = do_ssat(env,x,shift);
  return uVar1;
}

Assistant:

uint32_t HELPER(ssat)(CPUARMState *env, uint32_t x, uint32_t shift)
{
    return do_ssat(env, x, shift);
}